

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O2

void destroyQueue(queue *q)

{
  if (q == (queue *)0x0) {
    return;
  }
  while (q->size != 0) {
    destroyChunk(q->elements[q->head]);
    deque(q);
  }
  free(q->elements);
  free(q);
  return;
}

Assistant:

inline void destroyQueue(queue* q)
{
   if (q != NULL)
   {
       while (q->size > 0) //pop any chunks in the queue and free them
       {
           destroyChunk(front(q));
           deque(q);
       }

       free(q->elements); //free the elements chunk*[]
       free(q); //free the q
   }
}